

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::matrixMetric(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int type)

{
  type_conflict5 tVar1;
  int iVar2;
  int iVar3;
  int in_EDX;
  self_type *in_RSI;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  int i_2;
  int i_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absdiag;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxdiag;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  mindiag;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  int in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  int in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  cpp_dec_float<50U,_int,_void> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbc0;
  undefined1 local_434 [56];
  int local_3fc;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e4 [4];
  double in_stack_fffffffffffffc20;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffc28;
  int local_3ac;
  undefined8 local_3a8;
  undefined1 local_39c [56];
  undefined1 local_364 [56];
  undefined1 local_32c [56];
  int local_2f4;
  undefined1 local_2f0 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  undefined1 local_280 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  undefined8 local_210;
  undefined8 local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1fc;
  int local_1c4;
  undefined8 local_1b0;
  undefined8 *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  undefined8 local_198;
  undefined8 *local_190;
  const_reference local_180;
  undefined1 *local_178;
  const_reference local_170;
  undefined1 *local_168;
  const_reference local_160;
  undefined1 *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  undefined1 *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  undefined8 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined8 *local_a0;
  undefined8 *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined8 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  const_reference local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  const_reference local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_208 = 0;
  local_1a0 = &local_1fc;
  local_1a8 = &local_208;
  local_1b0 = 0;
  this_00 = in_RDI;
  local_1c4 = in_EDX;
  local_f8 = local_1a8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_RDI,(double)in_RDI,
             (type *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  iVar2 = (**(code **)(*(long *)(in_RSI->m_backend).data._M_elems + 0x20))();
  if (iVar2 == 0) {
    local_210 = 0x3ff0000000000000;
    local_190 = &local_210;
    local_198 = 0;
    local_100 = local_190;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (this_00,(double)in_RDI,
               (type *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  }
  else {
    if (local_1c4 == 0) {
      local_180 = std::
                  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)(in_RSI[8].m_backend.data._M_elems + 8),0);
      local_178 = local_280;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)CONCAT44(local_1c4,in_stack_fffffffffffffba0),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      local_170 = std::
                  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)(in_RSI[8].m_backend.data._M_elems + 8),0);
      local_168 = local_2f0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)CONCAT44(local_1c4,in_stack_fffffffffffffba0),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      local_2f4 = 1;
      iVar2 = local_1c4;
      while (in_stack_fffffffffffffba0 = local_2f4,
            iVar3 = (**(code **)(*(long *)(in_RSI->m_backend).data._M_elems + 0x20))(),
            in_stack_fffffffffffffba0 < iVar3) {
        local_160 = std::
                    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  *)(in_RSI[8].m_backend.data._M_elems + 8),(long)local_2f4);
        local_158 = local_364;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffba0),
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        tVar1 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x34b354);
        if (tVar1) {
          local_108 = &local_248;
          local_110 = local_32c;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffba0),
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        }
        else {
          tVar1 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x34b3a6);
          if (tVar1) {
            local_118 = &local_2b8;
            local_120 = local_32c;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffba0),
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
          }
        }
        local_2f4 = local_2f4 + 1;
      }
      local_d8 = local_39c;
      local_e0 = &local_2b8;
      local_e8 = &local_248;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_e9,local_e0,local_e8);
      local_d0 = local_39c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffba0));
      local_b8 = local_39c;
      local_c0 = local_e0;
      local_c8 = local_e8;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffba0),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 (cpp_dec_float<50U,_int,_void> *)0x34b4b2);
      local_128 = &local_1fc;
      local_130 = local_39c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffba0),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      local_1c4 = iVar2;
    }
    else if (local_1c4 == 1) {
      local_3a8 = 0;
      local_90 = &local_1fc;
      local_98 = &local_3a8;
      local_88 = local_98;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      local_3ac = 0;
      iVar2 = local_1c4;
      while (in_stack_fffffffffffffb9c = local_3ac,
            iVar3 = (**(code **)(*(long *)(in_RSI->m_backend).data._M_elems + 0x20))(),
            local_1c4 = iVar2, in_stack_fffffffffffffb9c < iVar3) {
        local_3f0 = 0x3ff0000000000000;
        local_38 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)(in_RSI[8].m_backend.data._M_elems + 8),(long)local_3ac);
        local_28 = local_3e4;
        local_30 = &local_3f0;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,local_38);
        local_20 = local_3e4;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffba0));
        local_10 = local_3e4;
        local_8 = local_30;
        local_18 = local_38;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffba0),
                   (double *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   (cpp_dec_float<50U,_int,_void> *)0x34b63f);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator+=(in_stack_fffffffffffffbc0,in_RSI);
        local_3ac = local_3ac + 1;
      }
    }
    else if (local_1c4 == 2) {
      local_3f8 = 0x3ff0000000000000;
      local_a8 = &local_1fc;
      local_b0 = &local_3f8;
      local_a0 = local_b0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      local_3fc = 0;
      iVar2 = local_1c4;
      while (in_stack_fffffffffffffb98 = local_3fc,
            iVar3 = (**(code **)(*(long *)(in_RSI->m_backend).data._M_elems + 0x20))(),
            in_stack_fffffffffffffb98 < iVar3) {
        std::
        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)(in_RSI[8].m_backend.data._M_elems + 8),(long)local_3fc);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator*=(in_stack_fffffffffffffbc0,in_RSI);
        local_3fc = local_3fc + 1;
      }
      local_68 = local_434;
      local_70 = &stack0xfffffffffffffbc0;
      local_78 = &local_1fc;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_79,local_78);
      local_60 = local_434;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffba0));
      local_50 = local_434;
      local_48 = local_70;
      local_58 = local_78;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffba0),
                 (double *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 (cpp_dec_float<50U,_int,_void> *)0x34b7ce);
      local_138 = &local_1fc;
      local_140 = local_434;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffba0),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      local_1c4 = iVar2;
    }
    local_150 = &local_1fc;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)CONCAT44(local_1c4,in_stack_fffffffffffffba0),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)this_00;
}

Assistant:

R SLUFactor<R>::matrixMetric(int type) const
{
   R result = 0.0;

   // catch corner case of empty matrix
   if(dim() == 0)
      return 1.0;

   switch(type)
   {
   // compute condition estimate by ratio of max/min of elements on the diagonal
   case 0:
   {
      R mindiag = spxAbs(this->diag[0]);
      R maxdiag = spxAbs(this->diag[0]);

      for(int i = 1; i < dim(); ++i)
      {
         R absdiag = spxAbs(this->diag[i]);

         if(absdiag < mindiag)
            mindiag = absdiag;
         else if(absdiag > maxdiag)
            maxdiag = absdiag;
      }

      result = maxdiag / mindiag;
      break;
   }

   // compute sum of inverses of all elements on the diagonal
   case 1:
      result = 0.0;

      for(int i = 0; i < dim(); ++i)
         result += 1.0 / this->diag[i];

      break;

   // compute determinant (product of all diagonal elements of U)
   case 2:
      result = 1.0;

      for(int i = 0; i < dim(); ++i)
         result *= this->diag[i];

      result = 1.0 / result;
      break;
   }

   return result;
}